

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3AlterRenameTable(Parse *pParse,SrcList *pSrc,Token *pName)

{
  int iVar1;
  uint uVar2;
  sqlite3 *db;
  int iVar3;
  Table *pTable;
  char *zName;
  Table *pTVar4;
  Index *pIVar5;
  Vdbe *p;
  Parse *pPVar6;
  undefined4 extraout_var;
  char *pcVar7;
  FKey *pFVar8;
  char *pcVar9;
  Schema **ppSVar10;
  char *pcVar11;
  int iDb;
  ulong uVar12;
  char *pcVar13;
  int p2;
  VTable *zP4;
  
  db = pParse->db;
  iVar1 = db->flags;
  if (db->mallocFailed == '\0') {
    zName = (char *)0x0;
    pTable = sqlite3LocateTableItem(pParse,0,pSrc->a);
    if (pTable != (Table *)0x0) {
      if (pTable->pSchema == (Schema *)0x0) {
        uVar12 = 0xfff0bdc0;
      }
      else {
        uVar2 = pParse->db->nDb;
        if ((int)uVar2 < 1) {
          uVar12 = 0;
        }
        else {
          ppSVar10 = &pParse->db->aDb->pSchema;
          uVar12 = 0;
          do {
            if (*ppSVar10 == pTable->pSchema) goto LAB_00157321;
            uVar12 = uVar12 + 1;
            ppSVar10 = ppSVar10 + 4;
          } while (uVar2 != uVar12);
          uVar12 = (ulong)uVar2;
        }
      }
LAB_00157321:
      iDb = (int)uVar12;
      pcVar13 = db->aDb[iDb].zName;
      db->flags = db->flags | 0x100000;
      zName = sqlite3NameFromToken(db,pName);
      if (zName == (char *)0x0) {
        zName = (char *)0x0;
      }
      else {
        pTVar4 = sqlite3FindTable(db,zName,pcVar13);
        if ((pTVar4 == (Table *)0x0) &&
           (pIVar5 = sqlite3FindIndex(db,zName,pcVar13), pIVar5 == (Index *)0x0)) {
          iVar3 = isSystemTable(pParse,pTable->zName);
          if ((iVar3 != 0) || (iVar3 = sqlite3CheckObjectName(pParse,zName), iVar3 != 0))
          goto LAB_00157392;
          pcVar11 = pTable->zName;
          if (pTable->pSelect == (Select *)0x0) {
            iVar3 = sqlite3AuthCheck(pParse,0x1a,pcVar13,pcVar11,(char *)0x0);
            if ((iVar3 == 0) && (iVar3 = sqlite3ViewGetColumnNames(pParse,pTable), iVar3 == 0)) {
              if ((pTable->tabFlags & 0x10) == 0) {
                zP4 = (VTable *)0x0;
              }
              else {
                for (zP4 = pTable->pVTable; (zP4 != (VTable *)0x0 && (zP4->db != db));
                    zP4 = zP4->pNext) {
                }
                if (zP4->pVtab->pModule->xRename == (_func_int_sqlite3_vtab_ptr_char_ptr *)0x0) {
                  zP4 = (VTable *)0x0;
                }
              }
              p = sqlite3GetVdbe(pParse);
              if (p != (Vdbe *)0x0) {
                sqlite3BeginWriteOperation(pParse,(uint)(zP4 != (VTable *)0x0),iDb);
                sqlite3ChangeCookie(pParse,iDb);
                if (zP4 != (VTable *)0x0) {
                  p2 = pParse->nMem + 1;
                  pParse->nMem = p2;
                  iVar3 = sqlite3VdbeAddOp3(p,0x5e,0,p2,0);
                  sqlite3VdbeChangeP4(p,iVar3,zName,0);
                  iVar3 = sqlite3VdbeAddOp3(p,0x8b,p2,0,0);
                  sqlite3VdbeChangeP4(p,iVar3,(char *)zP4,-10);
                  pPVar6 = pParse->pToplevel;
                  if (pParse->pToplevel == (Parse *)0x0) {
                    pPVar6 = pParse;
                  }
                  pPVar6->mayAbort = '\x01';
                }
                pcVar11 = pTable->zName;
                iVar3 = sqlite3Utf8CharLen(pcVar11,-1);
                if (((db->flags & 0x40000) != 0) &&
                   (pcVar7 = whereForeignKeys(pParse,pTable), pcVar7 != (char *)0x0)) {
                  pcVar9 = "sqlite_master";
                  if (iDb == 1) {
                    pcVar9 = "sqlite_temp_master";
                  }
                  sqlite3NestedParse(pParse,
                                     "UPDATE \"%w\".%s SET sql = sqlite_rename_parent(sql, %Q, %Q) WHERE %s;"
                                     ,pcVar13,pcVar9,pcVar11,zName,pcVar7);
                  sqlite3DbFree(db,pcVar7);
                }
                pcVar7 = "sqlite_master";
                if (iDb == 1) {
                  pcVar7 = "sqlite_temp_master";
                }
                sqlite3NestedParse(pParse,
                                   "UPDATE %Q.%s SET sql = CASE WHEN type = \'trigger\' THEN sqlite_rename_trigger(sql, %Q)ELSE sqlite_rename_table(sql, %Q) END, tbl_name = %Q, name = CASE WHEN type=\'table\' THEN %Q WHEN name LIKE \'sqlite_autoindex%%\' AND type=\'index\' THEN \'sqlite_autoindex_\' || %Q || substr(name,%d+18) ELSE name END WHERE tbl_name=%Q COLLATE nocase AND (type=\'table\' OR type=\'index\' OR type=\'trigger\');"
                                   ,pcVar13,pcVar7,zName,zName,zName,zName,zName,
                                   CONCAT44(extraout_var,iVar3),pcVar11);
                pTVar4 = sqlite3FindTable(db,"sqlite_sequence",pcVar13);
                if (pTVar4 != (Table *)0x0) {
                  sqlite3NestedParse(pParse,
                                     "UPDATE \"%w\".sqlite_sequence set name = %Q WHERE name = %Q",
                                     pcVar13,zName,pTable->zName);
                }
                pcVar13 = whereTempTriggers(pParse,pTable);
                if (pcVar13 != (char *)0x0) {
                  sqlite3NestedParse(pParse,
                                     "UPDATE sqlite_temp_master SET sql = sqlite_rename_trigger(sql, %Q), tbl_name = %Q WHERE %s;"
                                     ,zName,zName,pcVar13);
                  sqlite3DbFree(db,pcVar13);
                }
                if ((db->flags & 0x40000) != 0) {
                  for (pFVar8 = sqlite3FkReferences(pTable); pFVar8 != (FKey *)0x0;
                      pFVar8 = pFVar8->pNextTo) {
                    pTVar4 = pFVar8->pFrom;
                    if (pTVar4 != pTable) {
                      reloadTableSchema(pParse,pTVar4,pTVar4->zName);
                    }
                  }
                }
                reloadTableSchema(pParse,pTable,zName);
              }
            }
            goto LAB_00157392;
          }
          pcVar13 = "view %s may not be altered";
        }
        else {
          pcVar13 = "there is already another table or index with this name: %s";
          pcVar11 = zName;
        }
        sqlite3ErrorMsg(pParse,pcVar13,pcVar11);
      }
    }
  }
  else {
    zName = (char *)0x0;
  }
LAB_00157392:
  sqlite3SrcListDelete(db,pSrc);
  sqlite3DbFree(db,zName);
  db->flags = iVar1;
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3AlterRenameTable(
  Parse *pParse,            /* Parser context. */
  SrcList *pSrc,            /* The table to rename. */
  Token *pName              /* The new table name. */
){
  int iDb;                  /* Database that contains the table */
  char *zDb;                /* Name of database iDb */
  Table *pTab;              /* Table being renamed */
  char *zName = 0;          /* NULL-terminated version of pName */ 
  sqlite3 *db = pParse->db; /* Database connection */
  int nTabName;             /* Number of UTF-8 characters in zTabName */
  const char *zTabName;     /* Original name of the table */
  Vdbe *v;
#ifndef SQLITE_OMIT_TRIGGER
  char *zWhere = 0;         /* Where clause to locate temp triggers */
#endif
  VTable *pVTab = 0;        /* Non-zero if this is a v-tab with an xRename() */
  int savedDbFlags;         /* Saved value of db->flags */

  savedDbFlags = db->flags;  
  if( NEVER(db->mallocFailed) ) goto exit_rename_table;
  assert( pSrc->nSrc==1 );
  assert( sqlite3BtreeHoldsAllMutexes(pParse->db) );

  pTab = sqlite3LocateTableItem(pParse, 0, &pSrc->a[0]);
  if( !pTab ) goto exit_rename_table;
  iDb = sqlite3SchemaToIndex(pParse->db, pTab->pSchema);
  zDb = db->aDb[iDb].zName;
  db->flags |= SQLITE_PreferBuiltin;

  /* Get a NULL terminated version of the new table name. */
  zName = sqlite3NameFromToken(db, pName);
  if( !zName ) goto exit_rename_table;

  /* Check that a table or index named 'zName' does not already exist
  ** in database iDb. If so, this is an error.
  */
  if( sqlite3FindTable(db, zName, zDb) || sqlite3FindIndex(db, zName, zDb) ){
    sqlite3ErrorMsg(pParse, 
        "there is already another table or index with this name: %s", zName);
    goto exit_rename_table;
  }

  /* Make sure it is not a system table being altered, or a reserved name
  ** that the table is being renamed to.
  */
  if( SQLITE_OK!=isSystemTable(pParse, pTab->zName) ){
    goto exit_rename_table;
  }
  if( SQLITE_OK!=sqlite3CheckObjectName(pParse, zName) ){ goto
    exit_rename_table;
  }

#ifndef SQLITE_OMIT_VIEW
  if( pTab->pSelect ){
    sqlite3ErrorMsg(pParse, "view %s may not be altered", pTab->zName);
    goto exit_rename_table;
  }
#endif

#ifndef SQLITE_OMIT_AUTHORIZATION
  /* Invoke the authorization callback. */
  if( sqlite3AuthCheck(pParse, SQLITE_ALTER_TABLE, zDb, pTab->zName, 0) ){
    goto exit_rename_table;
  }
#endif

#ifndef SQLITE_OMIT_VIRTUALTABLE
  if( sqlite3ViewGetColumnNames(pParse, pTab) ){
    goto exit_rename_table;
  }
  if( IsVirtual(pTab) ){
    pVTab = sqlite3GetVTable(db, pTab);
    if( pVTab->pVtab->pModule->xRename==0 ){
      pVTab = 0;
    }
  }
#endif

  /* Begin a transaction and code the VerifyCookie for database iDb. 
  ** Then modify the schema cookie (since the ALTER TABLE modifies the
  ** schema). Open a statement transaction if the table is a virtual
  ** table.
  */
  v = sqlite3GetVdbe(pParse);
  if( v==0 ){
    goto exit_rename_table;
  }
  sqlite3BeginWriteOperation(pParse, pVTab!=0, iDb);
  sqlite3ChangeCookie(pParse, iDb);

  /* If this is a virtual table, invoke the xRename() function if
  ** one is defined. The xRename() callback will modify the names
  ** of any resources used by the v-table implementation (including other
  ** SQLite tables) that are identified by the name of the virtual table.
  */
#ifndef SQLITE_OMIT_VIRTUALTABLE
  if( pVTab ){
    int i = ++pParse->nMem;
    sqlite3VdbeAddOp4(v, OP_String8, 0, i, 0, zName, 0);
    sqlite3VdbeAddOp4(v, OP_VRename, i, 0, 0,(const char*)pVTab, P4_VTAB);
    sqlite3MayAbort(pParse);
  }
#endif

  /* figure out how many UTF-8 characters are in zName */
  zTabName = pTab->zName;
  nTabName = sqlite3Utf8CharLen(zTabName, -1);

#if !defined(SQLITE_OMIT_FOREIGN_KEY) && !defined(SQLITE_OMIT_TRIGGER)
  if( db->flags&SQLITE_ForeignKeys ){
    /* If foreign-key support is enabled, rewrite the CREATE TABLE 
    ** statements corresponding to all child tables of foreign key constraints
    ** for which the renamed table is the parent table.  */
    if( (zWhere=whereForeignKeys(pParse, pTab))!=0 ){
      sqlite3NestedParse(pParse, 
          "UPDATE \"%w\".%s SET "
              "sql = sqlite_rename_parent(sql, %Q, %Q) "
              "WHERE %s;", zDb, SCHEMA_TABLE(iDb), zTabName, zName, zWhere);
      sqlite3DbFree(db, zWhere);
    }
  }
#endif

  /* Modify the sqlite_master table to use the new table name. */
  sqlite3NestedParse(pParse,
      "UPDATE %Q.%s SET "
#ifdef SQLITE_OMIT_TRIGGER
          "sql = sqlite_rename_table(sql, %Q), "
#else
          "sql = CASE "
            "WHEN type = 'trigger' THEN sqlite_rename_trigger(sql, %Q)"
            "ELSE sqlite_rename_table(sql, %Q) END, "
#endif
          "tbl_name = %Q, "
          "name = CASE "
            "WHEN type='table' THEN %Q "
            "WHEN name LIKE 'sqlite_autoindex%%' AND type='index' THEN "
             "'sqlite_autoindex_' || %Q || substr(name,%d+18) "
            "ELSE name END "
      "WHERE tbl_name=%Q COLLATE nocase AND "
          "(type='table' OR type='index' OR type='trigger');", 
      zDb, SCHEMA_TABLE(iDb), zName, zName, zName, 
#ifndef SQLITE_OMIT_TRIGGER
      zName,
#endif
      zName, nTabName, zTabName
  );

#ifndef SQLITE_OMIT_AUTOINCREMENT
  /* If the sqlite_sequence table exists in this database, then update 
  ** it with the new table name.
  */
  if( sqlite3FindTable(db, "sqlite_sequence", zDb) ){
    sqlite3NestedParse(pParse,
        "UPDATE \"%w\".sqlite_sequence set name = %Q WHERE name = %Q",
        zDb, zName, pTab->zName);
  }
#endif

#ifndef SQLITE_OMIT_TRIGGER
  /* If there are TEMP triggers on this table, modify the sqlite_temp_master
  ** table. Don't do this if the table being ALTERed is itself located in
  ** the temp database.
  */
  if( (zWhere=whereTempTriggers(pParse, pTab))!=0 ){
    sqlite3NestedParse(pParse, 
        "UPDATE sqlite_temp_master SET "
            "sql = sqlite_rename_trigger(sql, %Q), "
            "tbl_name = %Q "
            "WHERE %s;", zName, zName, zWhere);
    sqlite3DbFree(db, zWhere);
  }
#endif

#if !defined(SQLITE_OMIT_FOREIGN_KEY) && !defined(SQLITE_OMIT_TRIGGER)
  if( db->flags&SQLITE_ForeignKeys ){
    FKey *p;
    for(p=sqlite3FkReferences(pTab); p; p=p->pNextTo){
      Table *pFrom = p->pFrom;
      if( pFrom!=pTab ){
        reloadTableSchema(pParse, p->pFrom, pFrom->zName);
      }
    }
  }
#endif

  /* Drop and reload the internal table schema. */
  reloadTableSchema(pParse, pTab, zName);

exit_rename_table:
  sqlite3SrcListDelete(db, pSrc);
  sqlite3DbFree(db, zName);
  db->flags = savedDbFlags;
}